

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::FinalizeNode(PeerManagerImpl *this,CNode *node)

{
  long lVar1;
  string_view logging_function;
  bool bVar2;
  __int_type _Var3;
  NodeId NVar4;
  CNodeState *flag;
  type_conflict6 *ptVar5;
  size_t in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  long *unaff_retaddr;
  type *list_it;
  type_conflict6 *node_id;
  QueuedBlock *entry;
  list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
  *__range1;
  CNodeState *state;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  range;
  iterator __end1;
  iterator __begin1;
  PeerRef peer;
  NodeId nodeid;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock31;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock30;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock29;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  *in_stack_fffffffffffffe50;
  NodeSeconds in_stack_fffffffffffffe58;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  *in_stack_fffffffffffffe60;
  iterator in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffe80;
  iterator in_stack_fffffffffffffe88;
  PeerManagerImpl *in_stack_fffffffffffffe90;
  int source_line;
  type *in_stack_fffffffffffffed8;
  ConstevalFormatString<1U> fmt;
  string_view in_stack_ffffffffffffff00;
  char *pcVar6;
  Level in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar6 = in_RDI;
  NVar4 = CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe88._M_node,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68._M_node >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe68._M_node >> 0x18,0));
  RemovePeer(in_stack_fffffffffffffe90,(NodeId)in_RDI);
  bVar2 = std::operator==((shared_ptr<(anonymous_namespace)::Peer> *)
                          in_stack_fffffffffffffe58.__d.__r,in_stack_fffffffffffffe50);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("peer != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x6ea,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  std::__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffe60);
  std::__atomic_base<int>::operator-=
            ((__atomic_base<int> *)in_stack_fffffffffffffe58.__d.__r,
             (__int_type)((ulong)in_stack_fffffffffffffe50 >> 0x20));
  _Var3 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffffe60);
  if (_Var3 < 0) {
    __assert_fail("m_wtxid_relay_peers >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x6ec,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  std::shared_ptr<(anonymous_namespace)::Peer>::~shared_ptr
            ((shared_ptr<(anonymous_namespace)::Peer> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  flag = State((PeerManagerImpl *)in_stack_fffffffffffffe58.__d.__r,
               (NodeId)in_stack_fffffffffffffe50);
  if (flag == (CNodeState *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x6ef,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  if ((flag->fSyncStarted & 1U) != 0) {
    *(int *)(in_RDI + 0x2a8) = *(int *)(in_RDI + 0x2a8) + -1;
  }
  fmt.fmt = (char *)flag;
  std::__cxx11::
  list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>::
  begin((list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
         *)in_stack_fffffffffffffe50);
  std::__cxx11::
  list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>::end
            ((list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
              *)in_stack_fffffffffffffe50);
  while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe58.__d.__r,
                                 (_Self *)in_stack_fffffffffffffe50), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::_List_iterator<(anonymous_namespace)::QueuedBlock>::operator*
              ((_List_iterator<(anonymous_namespace)::QueuedBlock> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    in_stack_fffffffffffffe90 = (PeerManagerImpl *)(in_RDI + 0x408);
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffffe58.__d.__r);
    std::
    multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
    ::equal_range((multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                   *)in_stack_fffffffffffffe58.__d.__r,(key_type *)in_stack_fffffffffffffe50);
    while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe58.__d.__r,
                                   (_Self *)in_stack_fffffffffffffe50), ((bVar2 ^ 0xffU) & 1) != 0)
    {
      std::
      _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      ptVar5 = std::get<0ul,long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>
                         ((pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_> *)
                          CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      in_stack_fffffffffffffed8 =
           std::get<1ul,long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>
                     ((pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_> *)
                      CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      if (*ptVar5 == NVar4) {
        in_stack_fffffffffffffe88 =
             std::
             multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
             ::erase_abi_cxx11_(in_stack_fffffffffffffe50,in_stack_fffffffffffffe68);
      }
      else {
        std::
        _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
        ::operator++(in_stack_fffffffffffffe60,
                     (int)((ulong)in_stack_fffffffffffffe58.__d.__r >> 0x20));
      }
    }
    std::_List_iterator<(anonymous_namespace)::QueuedBlock>::operator++
              ((_List_iterator<(anonymous_namespace)::QueuedBlock> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  }
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffe88._M_node,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68._M_node >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe68._M_node >> 0x18,0));
  TxOrphanage::EraseForPeer
            ((TxOrphanage *)in_stack_fffffffffffffe90,(NodeId)in_stack_fffffffffffffed8);
  TxRequestTracker::DisconnectedPeer
            ((TxRequestTracker *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             0x1070e7b);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_>
                      *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  if (bVar2) {
    std::unique_ptr<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_>::
    operator->((unique_ptr<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_> *
               )CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    TxReconciliationTracker::ForgetPeer
              ((TxReconciliationTracker *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0x1070ec2);
  }
  *(uint *)(in_RDI + 0x308) =
       *(int *)(in_RDI + 0x308) - (uint)(((CNodeState *)fmt.fmt)->fPreferredDownload & 1);
  bVar2 = std::__cxx11::
          list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
          ::empty((list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                   *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  *(uint *)(in_RDI + 0x458) = *(int *)(in_RDI + 0x458) - (uint)((bVar2 ^ 0xffU) & 1);
  if (*(int *)(in_RDI + 0x458) < 0) {
    __assert_fail("m_peers_downloading_from >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x707,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  *(uint *)(in_RDI + 0x304) =
       *(int *)(in_RDI + 0x304) - (uint)((((CNodeState *)fmt.fmt)->m_chain_sync).m_protect & 1);
  if (*(int *)(in_RDI + 0x304) < 0) {
    __assert_fail("m_outbound_peers_with_protect_from_disconnect >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x709,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  std::
  map<long,_(anonymous_namespace)::CNodeState,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
  ::erase((map<long,_(anonymous_namespace)::CNodeState,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
           *)in_stack_fffffffffffffe58.__d.__r,(key_type_conflict4 *)in_stack_fffffffffffffe50);
  bVar2 = std::
          map<long,_(anonymous_namespace)::CNodeState,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
          ::empty((map<long,_(anonymous_namespace)::CNodeState,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  if (bVar2) {
    bVar2 = std::
            multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
            ::empty((multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (!bVar2) {
      __assert_fail("mapBlocksInFlight.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                    ,0x70f,
                    "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                   );
    }
    if (*(int *)(in_RDI + 0x308) != 0) {
      __assert_fail("m_num_preferred_download_peers == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                    ,0x710,
                    "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                   );
    }
    if (*(int *)(in_RDI + 0x458) != 0) {
      __assert_fail("m_peers_downloading_from == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                    ,0x711,
                    "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                   );
    }
    if (*(int *)(in_RDI + 0x304) != 0) {
      __assert_fail("m_outbound_peers_with_protect_from_disconnect == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                    ,0x712,
                    "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                   );
    }
    _Var3 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffffe60);
    if (_Var3 != 0) {
      __assert_fail("m_wtxid_relay_peers == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                    ,0x713,
                    "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                   );
    }
    MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffe88._M_node,
               in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               (int)((ulong)in_stack_fffffffffffffe68._M_node >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe68._M_node >> 0x18,0));
    in_stack_fffffffffffffe80 =
         (AnnotatedMixin<std::mutex> *)
         TxRequestTracker::Size
                   ((TxRequestTracker *)
                    CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (in_stack_fffffffffffffe80 != (AnnotatedMixin<std::mutex> *)0x0) {
      __assert_fail("m_txrequest.Size() == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                    ,0x715,
                    "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                   );
    }
    in_stack_fffffffffffffe78 =
         (char *)TxOrphanage::Size((TxOrphanage *)
                                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (in_stack_fffffffffffffe78 != (char *)0x0) {
      __assert_fail("m_orphanage.Size() == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                    ,0x716,
                    "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                   );
    }
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffe60);
  if (((bVar2) &&
      (bVar2 = CNode::IsBlockOnlyConn
                         ((CNode *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)),
      !bVar2)) &&
     (bVar2 = CNode::IsInboundConn
                        ((CNode *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)),
     !bVar2)) {
    in_stack_fffffffffffffe68._M_node = *(_Base_ptr *)(in_RDI + 0x108);
    in_stack_fffffffffffffe70 = (char *)(in_RSI + 0x118);
    Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    AddrMan::Connected((AddrMan *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                       (CService *)0x1071279,in_stack_fffffffffffffe58);
  }
  source_line = (int)((ulong)in_RDI >> 0x20);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffe88._M_node,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68._M_node >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe68._M_node >> 0x18,0));
  std::
  map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
  ::erase((map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
           *)in_stack_fffffffffffffe58.__d.__r,(key_type_conflict4 *)in_stack_fffffffffffffe50);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),Trace);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe68._M_node
               ,(char *)in_stack_fffffffffffffe60);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe68._M_node
               ,(char *)in_stack_fffffffffffffe60);
    logging_function._M_str = pcVar6;
    logging_function._M_len = in_RSI;
    LogPrintFormatInternal<long>
              (logging_function,in_stack_ffffffffffffff00,source_line,(LogFlags)flag,
               in_stack_fffffffffffffff0,fmt,unaff_retaddr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::FinalizeNode(const CNode& node)
{
    NodeId nodeid = node.GetId();
    {
    LOCK(cs_main);
    {
        // We remove the PeerRef from g_peer_map here, but we don't always
        // destruct the Peer. Sometimes another thread is still holding a
        // PeerRef, so the refcount is >= 1. Be careful not to do any
        // processing here that assumes Peer won't be changed before it's
        // destructed.
        PeerRef peer = RemovePeer(nodeid);
        assert(peer != nullptr);
        m_wtxid_relay_peers -= peer->m_wtxid_relay;
        assert(m_wtxid_relay_peers >= 0);
    }
    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    if (state->fSyncStarted)
        nSyncStarted--;

    for (const QueuedBlock& entry : state->vBlocksInFlight) {
        auto range = mapBlocksInFlight.equal_range(entry.pindex->GetBlockHash());
        while (range.first != range.second) {
            auto [node_id, list_it] = range.first->second;
            if (node_id != nodeid) {
                range.first++;
            } else {
                range.first = mapBlocksInFlight.erase(range.first);
            }
        }
    }
    {
        LOCK(m_tx_download_mutex);
        m_orphanage.EraseForPeer(nodeid);
        m_txrequest.DisconnectedPeer(nodeid);
    }
    if (m_txreconciliation) m_txreconciliation->ForgetPeer(nodeid);
    m_num_preferred_download_peers -= state->fPreferredDownload;
    m_peers_downloading_from -= (!state->vBlocksInFlight.empty());
    assert(m_peers_downloading_from >= 0);
    m_outbound_peers_with_protect_from_disconnect -= state->m_chain_sync.m_protect;
    assert(m_outbound_peers_with_protect_from_disconnect >= 0);

    m_node_states.erase(nodeid);

    if (m_node_states.empty()) {
        // Do a consistency check after the last peer is removed.
        assert(mapBlocksInFlight.empty());
        assert(m_num_preferred_download_peers == 0);
        assert(m_peers_downloading_from == 0);
        assert(m_outbound_peers_with_protect_from_disconnect == 0);
        assert(m_wtxid_relay_peers == 0);
        LOCK(m_tx_download_mutex);
        assert(m_txrequest.Size() == 0);
        assert(m_orphanage.Size() == 0);
    }
    } // cs_main
    if (node.fSuccessfullyConnected &&
        !node.IsBlockOnlyConn() && !node.IsInboundConn()) {
        // Only change visible addrman state for full outbound peers.  We don't
        // call Connected() for feeler connections since they don't have
        // fSuccessfullyConnected set.
        m_addrman.Connected(node.addr);
    }
    {
        LOCK(m_headers_presync_mutex);
        m_headers_presync_stats.erase(nodeid);
    }
    LogDebug(BCLog::NET, "Cleared nodestate for peer=%d\n", nodeid);
}